

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O3

void __thiscall
btSoftBody::appendAnchor
          (btSoftBody *this,int node,btRigidBody *body,btVector3 *localPivot,
          bool disableCollisionBetweenLinkedBodies,btScalar influence)

{
  int *piVar1;
  undefined8 *puVar2;
  undefined1 *puVar3;
  undefined8 *puVar4;
  btCollisionObject **ptr;
  Node *pNVar5;
  Anchor *pAVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  btCollisionObject **ppbVar15;
  Anchor *pAVar16;
  ulong uVar17;
  long lVar18;
  undefined3 in_register_00000081;
  int iVar19;
  
  if (CONCAT31(in_register_00000081,disableCollisionBetweenLinkedBodies) != 0) {
    iVar12 = (this->m_collisionDisabledObjects).m_size;
    uVar14 = (ulong)iVar12;
    if (0 < (long)uVar14) {
      uVar17 = 0;
      do {
        if ((btRigidBody *)(this->m_collisionDisabledObjects).m_data[uVar17] == body) {
          if (iVar12 != (int)uVar17) goto LAB_001d48f6;
          break;
        }
        uVar17 = uVar17 + 1;
      } while (uVar14 != uVar17);
    }
    if (iVar12 == (this->m_collisionDisabledObjects).m_capacity) {
      iVar19 = 1;
      if (iVar12 != 0) {
        iVar19 = iVar12 * 2;
      }
      if (iVar12 < iVar19) {
        if (iVar19 == 0) {
          ppbVar15 = (btCollisionObject **)0x0;
        }
        else {
          ppbVar15 = (btCollisionObject **)btAlignedAllocInternal((long)iVar19 << 3,0x10);
          uVar14 = (ulong)(uint)(this->m_collisionDisabledObjects).m_size;
        }
        iVar12 = (int)uVar14;
        if (0 < iVar12) {
          uVar17 = 0;
          do {
            ppbVar15[uVar17] = (this->m_collisionDisabledObjects).m_data[uVar17];
            uVar17 = uVar17 + 1;
          } while ((uVar14 & 0xffffffff) != uVar17);
        }
        ptr = (this->m_collisionDisabledObjects).m_data;
        if ((ptr != (btCollisionObject **)0x0) &&
           ((this->m_collisionDisabledObjects).m_ownsMemory == true)) {
          btAlignedFreeInternal(ptr);
          iVar12 = (this->m_collisionDisabledObjects).m_size;
        }
        (this->m_collisionDisabledObjects).m_ownsMemory = true;
        (this->m_collisionDisabledObjects).m_data = ppbVar15;
        (this->m_collisionDisabledObjects).m_capacity = iVar19;
      }
    }
    (this->m_collisionDisabledObjects).m_data[iVar12] = &body->super_btCollisionObject;
    (this->m_collisionDisabledObjects).m_size = iVar12 + 1;
  }
LAB_001d48f6:
  pNVar5 = (this->m_nodes).m_data;
  uVar7 = *(undefined8 *)localPivot->m_floats;
  uVar8 = *(undefined8 *)(localPivot->m_floats + 2);
  puVar3 = &pNVar5[node].field_0x70;
  *puVar3 = *puVar3 | 1;
  uVar13 = (this->m_anchors).m_size;
  if (uVar13 == (this->m_anchors).m_capacity) {
    iVar12 = 1;
    if (uVar13 != 0) {
      iVar12 = uVar13 * 2;
    }
    if ((int)uVar13 < iVar12) {
      if (iVar12 == 0) {
        pAVar16 = (Anchor *)0x0;
      }
      else {
        pAVar16 = (Anchor *)btAlignedAllocInternal((long)iVar12 * 0x68,0x10);
        uVar13 = (this->m_anchors).m_size;
      }
      if (0 < (int)uVar13) {
        lVar18 = 0;
        do {
          pAVar6 = (this->m_anchors).m_data;
          *(undefined4 *)((long)(pAVar16->m_c0).m_el[0].m_floats + lVar18 + -4) =
               *(undefined4 *)((long)(pAVar6->m_c0).m_el[0].m_floats + lVar18 + -4);
          puVar2 = (undefined8 *)((long)(pAVar6->m_local).m_floats + lVar18 + -8);
          uVar9 = *puVar2;
          uVar10 = puVar2[1];
          puVar2 = (undefined8 *)((long)(pAVar6->m_local).m_floats + lVar18 + 8);
          uVar11 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar16->m_local).m_floats + lVar18 + 8);
          *puVar4 = *puVar2;
          puVar4[1] = uVar11;
          puVar2 = (undefined8 *)((long)(pAVar16->m_local).m_floats + lVar18 + -8);
          *puVar2 = uVar9;
          puVar2[1] = uVar10;
          puVar2 = (undefined8 *)((long)(pAVar6->m_c0).m_el[0].m_floats + lVar18);
          uVar9 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar16->m_c0).m_el[0].m_floats + lVar18);
          *puVar4 = *puVar2;
          puVar4[1] = uVar9;
          puVar2 = (undefined8 *)((long)(pAVar6->m_c0).m_el[1].m_floats + lVar18);
          uVar9 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar16->m_c0).m_el[1].m_floats + lVar18);
          *puVar4 = *puVar2;
          puVar4[1] = uVar9;
          puVar2 = (undefined8 *)((long)(pAVar6->m_c0).m_el[2].m_floats + lVar18);
          uVar9 = puVar2[1];
          puVar4 = (undefined8 *)((long)(pAVar16->m_c0).m_el[2].m_floats + lVar18);
          *puVar4 = *puVar2;
          puVar4[1] = uVar9;
          *(undefined4 *)((long)(&pAVar16->m_c1 + 1) + lVar18) =
               *(undefined4 *)((long)(&pAVar6->m_c1 + 1) + lVar18);
          puVar4 = (undefined8 *)((long)(pAVar6->m_c1).m_floats + lVar18);
          uVar9 = puVar4[1];
          puVar2 = (undefined8 *)((long)(pAVar16->m_c1).m_floats + lVar18);
          *puVar2 = *puVar4;
          puVar2[1] = uVar9;
          lVar18 = lVar18 + 0x68;
        } while ((ulong)uVar13 * 0x68 - lVar18 != 0);
      }
      pAVar6 = (this->m_anchors).m_data;
      if ((pAVar6 != (Anchor *)0x0) && ((this->m_anchors).m_ownsMemory == true)) {
        btAlignedFreeInternal(pAVar6);
      }
      (this->m_anchors).m_ownsMemory = true;
      (this->m_anchors).m_data = pAVar16;
      (this->m_anchors).m_capacity = iVar12;
      uVar13 = (this->m_anchors).m_size;
    }
  }
  pAVar16 = (this->m_anchors).m_data;
  pAVar16[(int)uVar13].m_node = pNVar5 + node;
  *(undefined8 *)pAVar16[(int)uVar13].m_local.m_floats = uVar7;
  *(undefined8 *)(pAVar16[(int)uVar13].m_local.m_floats + 2) = uVar8;
  pAVar16[(int)uVar13].m_body = body;
  pAVar16[(int)uVar13].m_influence = influence;
  piVar1 = &(this->m_anchors).m_size;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void			btSoftBody::appendAnchor(int node,btRigidBody* body, const btVector3& localPivot,bool disableCollisionBetweenLinkedBodies,btScalar influence)
{
	if (disableCollisionBetweenLinkedBodies)
	{
		if (m_collisionDisabledObjects.findLinearSearch(body)==m_collisionDisabledObjects.size())
		{
			m_collisionDisabledObjects.push_back(body);
		}
	}

	Anchor	a;
	a.m_node			=	&m_nodes[node];
	a.m_body			=	body;
	a.m_local			=	localPivot;
	a.m_node->m_battach	=	1;
	a.m_influence = influence;
	m_anchors.push_back(a);
}